

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
booster::locale::pgettext<char>(char *context,char *id,locale *loc)

{
  basic_message<char> *in_RDI;
  basic_message<char> *this;
  basic_message<char> *this_00;
  basic_message<char> *in_stack_ffffffffffffff50;
  basic_message<char> local_a0;
  
  this_00 = &local_a0;
  this = in_RDI;
  basic_message<char>::basic_message
            (in_stack_ffffffffffffff50,(char_type *)this_00,(char_type *)in_RDI);
  basic_message<char>::str_abi_cxx11_(this_00,(locale *)this);
  basic_message<char>::~basic_message(this);
  return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI;
}

Assistant:

std::basic_string<CharType>  pgettext(  CharType const *context,
                                                CharType const *id,
                                                std::locale const &loc=std::locale())
        {
            return basic_message<CharType>(context,id).str(loc);
        }